

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * pack11_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in - base;
  *out = (in[1] - base) * 0x800 | *out;
  *out = (in[2] - base) * 0x400000 | *out;
  puVar1 = out + 1;
  *puVar1 = in[2] - base >> 10;
  *puVar1 = (in[3] - base) * 2 | *puVar1;
  *puVar1 = (in[4] - base) * 0x1000 | *puVar1;
  *puVar1 = (in[5] - base) * 0x800000 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[5] - base >> 9;
  *puVar1 = (in[6] - base) * 4 | *puVar1;
  *puVar1 = (in[7] - base) * 0x2000 | *puVar1;
  return out + 3;
}

Assistant:

uint32_t * pack11_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  11 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  22 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 11  -  1 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  1 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  12 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  23 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 11  -  2 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  2 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  13 ;
    ++in;

    return out + 1;
}